

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O1

string * __thiscall
BayesianGameIdenticalPayoff::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameIdenticalPayoff *this)

{
  char cVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  double extraout_XMM0_Qa;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  BayesianGameBase::SoftPrint_abi_cxx11_(&local_1d8,(BayesianGameBase *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Utility function:",0x11);
  cVar1 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if ((this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJTypes != 0) {
    uVar4 = 0;
    do {
      if ((this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJA != 0) {
        uVar3 = 0;
        do {
          (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[0x10])(this,uVar4,uVar3);
          poVar2 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          uVar3 = (ulong)((int)uVar3 + 1);
        } while (uVar3 < (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                         _m_nrJA);
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (uVar4 < (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                     _m_nrJTypes);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameIdenticalPayoff::SoftPrint() const
{
    stringstream ss;
    ss << BayesianGameBase::SoftPrint();    
    ss << "Utility function:"<<endl;
    for(Index jtype=0; jtype < _m_nrJTypes; jtype++)
    {
        for(Index jaI=0; jaI < _m_nrJA; jaI++)
            ss << GetUtility(jtype,jaI) << " ";
        ss << endl;
    }
//    ss << _m_utilFunction->SoftPrint();
    return(ss.str());
}